

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestViewSampling::initParentTextureContents(TextureViewTestViewSampling *this)

{
  _reference_color_storage *p_Var1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  void *pvVar6;
  TestError *this_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  GLenum texture_targets [6];
  ulong local_68;
  ulong local_58;
  GLenum aGStack_50 [6];
  ulong local_38;
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0xb8))(this->m_iteration_parent_texture_target,this->m_to_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1579);
  uVar4 = this->m_iteration_parent_texture_target;
  if ((int)uVar4 < 0x9009) {
    if ((uVar4 == 0x8c18) || (uVar4 == 0x8c1a)) goto LAB_00a31360;
  }
  else if ((uVar4 == 0x9009) || ((uVar4 == 0x9100 || (uVar4 == 0x9102)))) {
LAB_00a31360:
    uVar7 = (uint)(uVar4 == 0x9009) * 5 + 1;
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,uVar7,
               this->m_iteration_parent_texture_n_levels,this->m_max_color_texture_samples_gl_value)
    ;
    iVar2 = this->m_max_color_texture_samples_gl_value << 2;
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar12 = (long)iVar2 * 4;
    }
    pvVar6 = operator_new__(uVar12);
    (**(code **)(lVar5 + 0x1680))(this->m_per_sample_filler_po_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x160a);
    if (this->m_iteration_parent_texture_depth != 0) {
      uVar9 = this->m_iteration_parent_texture_n_levels;
      uVar19 = 0;
      do {
        uVar17 = 0;
        uVar8 = uVar9;
        do {
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            uVar10 = 0;
            do {
              if (this->m_iteration_parent_texture_target == 0x9100) {
                (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0x9100);
                dVar3 = (**(code **)(lVar5 + 0x800))();
                pcVar13 = "glFramebufferTexture2D() call failed.";
                iVar2 = 0x1627;
              }
              else {
                (**(code **)(lVar5 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,uVar10);
                dVar3 = (**(code **)(lVar5 + 0x800))();
                pcVar13 = "glFramebufferTextureLayer() call failed.";
                iVar2 = 0x161d;
              }
              glu::checkError(dVar3,pcVar13,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,iVar2);
              auVar21 = _DAT_01aa42b0;
              if ((uVar4 | 2) == 0x9102) {
                uVar9 = this->m_max_color_texture_samples_gl_value;
                if (uVar9 != 0) goto LAB_00a314e3;
                uVar12 = 0;
              }
              else {
                uVar9 = 1;
LAB_00a314e3:
                uVar12 = (ulong)uVar9;
                iVar2 = getRandomReferenceColor::seed << 5;
                uVar8 = getRandomReferenceColor::seed << 4;
                uVar9 = getRandomReferenceColor::seed * 8;
                uVar14 = 0;
                uVar15 = 0;
                do {
                  auVar22._4_4_ = uVar9;
                  auVar22._0_4_ = uVar9;
                  auVar22._8_4_ = iVar2;
                  auVar22._12_4_ = iVar2;
                  auVar20._0_4_ = (float)(getRandomReferenceColor::seed % 0xff);
                  auVar20._4_4_ = (float)(uVar9 % 0xff);
                  auVar20._8_4_ = (float)(uVar8 % 0xff);
                  auVar20._12_4_ =
                       (float)((int)((auVar22._8_8_ & 0xffffffff) / 0xff) * -0xff + iVar2);
                  auVar20 = divps(auVar20,auVar21);
                  *(undefined1 (*) [16])((long)pvVar6 + (ulong)uVar14 * 4) = auVar20;
                  p_Var1 = this->m_reference_color_storage;
                  if (p_Var1 != (_reference_color_storage *)0x0) {
                    *(undefined1 (*) [16])
                     p_Var1->data
                     [((p_Var1->n_faces * uVar19 + uVar17) * p_Var1->n_mipmaps + uVar10) *
                      p_Var1->n_samples + (int)uVar15].m_data = auVar20;
                  }
                  uVar15 = uVar15 + 1;
                  uVar14 = uVar14 + 4;
                  iVar2 = iVar2 + 0x220;
                  uVar8 = uVar8 + 0x110;
                  uVar9 = uVar9 + 0x88;
                  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
                } while (uVar12 != uVar15);
              }
              (**(code **)(lVar5 + 0x15a8))
                        (this->m_per_sample_filler_po_reference_colors_location,uVar12,pvVar6);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              glu::checkError(dVar3,"glUniform4fv() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x163c);
              (**(code **)(lVar5 + 0x14f0))
                        (this->m_per_sample_filler_po_layer_id_location,uVar19 + uVar17 * 6);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              glu::checkError(dVar3,"glUniform1i() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x1642);
              (**(code **)(lVar5 + 0x538))(0,0,1);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              glu::checkError(dVar3,"glDrawArrays() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x1649);
              uVar10 = uVar10 + 1;
              uVar9 = this->m_iteration_parent_texture_n_levels;
              uVar8 = uVar9;
            } while (uVar10 < uVar9);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar7);
        uVar19 = uVar19 + 1;
      } while (uVar19 < this->m_iteration_parent_texture_depth);
    }
    operator_delete__(pvVar6);
    return;
  }
  aGStack_50[0] = 0;
  aGStack_50[1] = 0;
  aGStack_50[2] = 0;
  aGStack_50[3] = 0;
  local_58 = (ulong)uVar4;
  uVar7 = 1;
  if (uVar4 == 0x8513) {
    local_58._0_4_ = 0x8515;
    local_58._4_4_ = 0x8516;
    aGStack_50[0] = 0x8517;
    aGStack_50[1] = 0x8518;
    aGStack_50[2] = 0x8519;
    aGStack_50[3] = 0x851a;
    uVar7 = 6;
  }
  resetReferenceColorStorage
            (this,this->m_iteration_parent_texture_depth,uVar7,
             this->m_iteration_parent_texture_n_levels,1);
  local_38 = (ulong)uVar7;
  uVar4 = this->m_iteration_parent_texture_depth;
  local_68 = 0;
  uVar7 = uVar4;
  do {
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      iVar2 = *(int *)((long)&local_58 + local_68 * 4);
      uVar9 = 0;
      uVar19 = iVar2 - 0x84f5;
      do {
        uVar7 = 0;
        if (iVar2 == 0x806f) {
          uVar7 = uVar9;
        }
        iVar16 = this->m_iteration_parent_texture_n_levels - uVar7;
        if (iVar16 != 0) {
          if ((((0x25 < uVar19) || ((0x3f00000001U >> ((ulong)uVar19 & 0x3f) & 1) == 0)) &&
              (1 < iVar2 - 0xde0U)) && (iVar2 != 0x806f)) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unrecognized texture target",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x15da);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          iVar18 = 0;
          do {
            if (((uVar19 < 0x26) && ((0x3f00000001U >> ((ulong)uVar19 & 0x3f) & 1) != 0)) ||
               (iVar2 == 0xde1)) {
              (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,iVar2,this->m_to_id,iVar18);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              pcVar13 = "glFramebufferTexture2D() call failed.";
              iVar11 = 0x15cb;
            }
            else if (iVar2 == 0xde0) {
              (**(code **)(lVar5 + 0x698))(0x8ca9,0x8ce0,0xde0,this->m_to_id,iVar18);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              pcVar13 = "glFramebufferTexture1D() call failed.";
              iVar11 = 0x15bb;
            }
            else {
              (**(code **)(lVar5 + 0x6a8))(0x8ca9,0x8ce0,0x806f,this->m_to_id,iVar18,uVar9);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              pcVar13 = "glFramebufferTexture3D() call failed.";
              iVar11 = 0x15d4;
            }
            glu::checkError(dVar3,pcVar13,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,iVar11);
            uVar4 = getRandomReferenceColor::seed * 8;
            iVar11 = getRandomReferenceColor::seed * 0x20;
            auVar23._4_4_ = uVar4;
            auVar23._0_4_ = uVar4;
            auVar23._8_4_ = iVar11;
            auVar23._12_4_ = iVar11;
            auVar21._0_4_ = (float)(getRandomReferenceColor::seed % 0xff);
            auVar21._4_4_ = (float)(uVar4 % 0xff);
            auVar21._8_4_ = (float)((getRandomReferenceColor::seed * 0x10) % 0xff);
            auVar21._12_4_ = (float)((int)((auVar23._8_8_ & 0xffffffff) / 0xff) * -0xff + iVar11);
            auVar21 = divps(auVar21,_DAT_01aa42b0);
            getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
            p_Var1 = this->m_reference_color_storage;
            if (p_Var1 != (_reference_color_storage *)0x0) {
              *(undefined1 (*) [16])
               p_Var1->data
               [((p_Var1->n_faces * uVar9 + (int)local_68) * p_Var1->n_mipmaps + iVar18) *
                p_Var1->n_samples].m_data = auVar21;
            }
            (**(code **)(lVar5 + 0x1c0))();
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"glClearColor() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15e7);
            (**(code **)(lVar5 + 0x188))(0x4000);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"glClear() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15ea);
            iVar18 = iVar18 + 1;
          } while (iVar16 + (uint)(iVar16 == 0) != iVar18);
          uVar4 = this->m_iteration_parent_texture_depth;
        }
        uVar9 = uVar9 + 1;
        uVar7 = uVar4;
      } while (uVar9 < uVar4);
    }
    local_68 = local_68 + 1;
    if (local_68 == local_38) {
      return;
    }
  } while( true );
}

Assistant:

void TextureViewTestViewSampling::initParentTextureContents()
{
	static const glw::GLenum cm_texture_targets[] = {
		/* NOTE: This order must match the order used for sampling CM/CMA texture targets. */
		GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};
	static const unsigned int n_cm_texture_targets = sizeof(cm_texture_targets) / sizeof(cm_texture_targets[0]);
	const glw::Functions&	 gl				   = m_context.getRenderContext().getFunctions();

	/* Bind the parent texture */
	gl.bindTexture(m_iteration_parent_texture_target, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* If we're dealing with a single-sampled texture target, then we can clear the
	 * contents of each layer/face/slice using FBO. This will unfortunately not work
	 * for arrayed textures, layers or layer-faces of which cannot be attached to a draw
	 * framebuffer.
	 * If we need to update contents of a multisampled, potentially arrayed texture,
	 * we'll need to use the filler program.
	 **/
	bool is_arrayed_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
	bool is_multisampled_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
										   m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	if (!is_arrayed_texture_target && !is_multisampled_texture_target)
	{
		/* Good, no need to work with samples! */
		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		/* Cube-map texture target cannot be directly used for a glFramebufferTexture2D() call. Instead,
		 * we need to split it into 6 cube-map texture targets. */
		unsigned int n_texture_targets					   = 1;
		glw::GLenum  texture_targets[n_cm_texture_targets] = {
			m_iteration_parent_texture_target, GL_NONE, GL_NONE, GL_NONE, GL_NONE, GL_NONE,
		};

		if (m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT(sizeof(texture_targets) == sizeof(cm_texture_targets));
			memcpy(texture_targets, cm_texture_targets, sizeof(cm_texture_targets));

			n_texture_targets = n_cm_texture_targets;
		}

		resetReferenceColorStorage(m_iteration_parent_texture_depth,	/* n_layers */
								   n_texture_targets,					/* n_faces */
								   m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   1);									/* n_samples */

		/* Iterate through all texture targets we need to update */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Iterate through all layers of the texture. */
			for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
			{
				/* ..and mip-maps, too. */
				const unsigned int n_mipmaps_for_layer = (texture_target == GL_TEXTURE_3D) ?
															 (m_iteration_parent_texture_n_levels - n_layer) :
															 (m_iteration_parent_texture_n_levels);

				for (unsigned int n_mipmap = 0; n_mipmap < n_mipmaps_for_layer; ++n_mipmap)
				{
					/* Use appropriate glFramebufferTexture*() API, depending on the texture target of the
					 * parent texture.
					 */
					switch (texture_target)
					{
					case GL_TEXTURE_1D:
					{
						gl.framebufferTexture1D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_1D, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D() call failed.");
						break;
					}

					case GL_TEXTURE_2D:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
					case GL_TEXTURE_RECTANGLE:
					{
						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
						break;
					}

					case GL_TEXTURE_3D:
					{
						gl.framebufferTexture3D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_3D, m_to_id,
												n_mipmap, n_layer);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture3D() call failed.");
						break;
					}

					default:
					{
						TCU_FAIL("Unrecognized texture target");
					}
					} /* switch (m_iteration_parent_texture_target) */

					/* Each layer/mipmap needs to be assigned an unique vec4. */
					tcu::Vec4 reference_color = getRandomReferenceColor();

					setReferenceColor(n_layer, n_texture_target, /* n_face */
									  n_mipmap, 0,				 /* n_sample */
									  reference_color);

					/* We should be OK to clear the mip-map at this point */
					gl.clearColor(reference_color.x(), reference_color.y(), reference_color.z(), reference_color.w());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

					gl.clear(GL_COLOR_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all layers) */
		}		  /* for (all texture targets) */
	}			  /* if (!is_arrayed_texture_target && !is_multisampled_texture_target) */
	else
	{
		/* We need to handle an either multisampled or arrayed texture target or
		 * a combination of the two.
		 */
		DE_ASSERT(m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		const unsigned int n_faces =
			(m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY) ? 6 /* faces */ : 1;

		resetReferenceColorStorage(m_iteration_parent_texture_depth,			 /* n_layers */
								   n_faces, m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   m_max_color_texture_samples_gl_value);		 /* n_samples */

		/* Set up storage for reference colors the fragment shader should use
		 * when rendering to multisampled texture target */
		float* reference_colors = new float[4 /* rgba */ * m_max_color_texture_samples_gl_value];

		/* Activate the filler program */
		gl.useProgram(m_per_sample_filler_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		/* Iterate through all layers of the texture. */
		for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
		{
			/* ..faces.. */
			for (unsigned int n_face = 0; n_face < n_faces; ++n_face)
			{
				/* ..and mip-maps, too. */
				for (unsigned int n_mipmap = 0; n_mipmap < m_iteration_parent_texture_n_levels; ++n_mipmap)
				{
					/* For all texture targets considered excl. GL_TEXTURE_2D_MULTISAMPLE, we need
					 * to use glFramebufferTextur() to bind all layers to the color atatchment. For
					 * 2DMS textures, we can use plain glFramebufferTexture2D().
					 */
					if (m_iteration_parent_texture_target != GL_TEXTURE_2D_MULTISAMPLE)
					{
						gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");
					}
					else
					{
						/* Sanity check */
						DE_ASSERT(m_iteration_parent_texture_depth == 1);

						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												m_iteration_parent_texture_target, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
					}

					/* Generate reference colors for all samples */
					const unsigned int n_samples =
						(is_multisampled_texture_target) ? m_max_color_texture_samples_gl_value : 1;

					for (unsigned int n_sample = 0; n_sample < n_samples; ++n_sample)
					{
						tcu::Vec4 reference_color = getRandomReferenceColor();

						reference_colors[4 /* rgba */ * n_sample + 0] = reference_color.x();
						reference_colors[4 /* rgba */ * n_sample + 1] = reference_color.y();
						reference_colors[4 /* rgba */ * n_sample + 2] = reference_color.z();
						reference_colors[4 /* rgba */ * n_sample + 3] = reference_color.w();

						setReferenceColor(n_layer, n_face, n_mipmap, n_sample, reference_color);
					} /* for (all samples) */

					/* Upload the reference sample colors */
					gl.uniform4fv(m_per_sample_filler_po_reference_colors_location, n_samples, reference_colors);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

					/* Update the layer ID the program should render to */
					const unsigned int layer_id = n_face * 6 /* faces */ + n_layer;

					gl.uniform1i(m_per_sample_filler_po_layer_id_location, layer_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

					/* Draw the full-screen quad. Geometry shader will draw the quad for us,
					 * so all we need to do is to feed the rendering pipeline with a single
					 * point.
					 */
					gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all faces) */
		}		  /* for (all layers) */

		delete[] reference_colors;
	}
}